

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename,
          string *insertion_point,GeneratedCodeInfo *info)

{
  pointer pcVar1;
  StringOutputStream *this_00;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_0190bbb8;
  this->directory_ = directory;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename_,pcVar1,pcVar1 + filename->_M_string_length);
  (this->insertion_point_)._M_dataplus._M_p = (pointer)&(this->insertion_point_).field_2;
  pcVar1 = (insertion_point->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->insertion_point_,pcVar1,pcVar1 + insertion_point->_M_string_length);
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this_00 = (StringOutputStream *)operator_new(0x10);
  io::StringOutputStream::StringOutputStream(this_00,&this->data_);
  (this->inner_)._M_t.
  super___uniq_ptr_impl<google::protobuf::io::StringOutputStream,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::StringOutputStream_*,_std::default_delete<google::protobuf::io::StringOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::StringOutputStream_*,_false>._M_head_impl = this_00;
  GeneratedCodeInfo::GeneratedCodeInfo(&this->info_to_insert_,(Arena *)0x0,info);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const std::string& filename,
    const std::string& insertion_point, const google::protobuf::GeneratedCodeInfo& info)
    : directory_(directory),
      filename_(filename),
      insertion_point_(insertion_point),
      inner_(new io::StringOutputStream(&data_)),
      info_to_insert_(info) {}